

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool __thiscall
ON_RTree::Search(ON_RTree *this,ON_Polyline *polyline,
                _func_bool_void_ptr_ON__INT_PTR *resultCallback,ON_RTreePolylineContext *a_context)

{
  bool bVar1;
  ON_Workspace ws;
  ON_RTreeSearchPolylineResultCallback result;
  ON_Workspace OStack_48;
  ON_RTreeSearchPolylineResultCallback local_38;
  
  bVar1 = false;
  if ((((resultCallback != (_func_bool_void_ptr_ON__INT_PTR *)0x0) &&
       (bVar1 = false, polyline != (ON_Polyline *)0x0)) && (this->m_root != (ON_RTreeNode *)0x0)) &&
     (bVar1 = true,
     1 < (uint)(polyline->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count)) {
    local_38.super_ON_RTreeSearchResultCallback.m_context = a_context;
    local_38.super_ON_RTreeSearchResultCallback.m_resultCallback = resultCallback;
    ON_Workspace::ON_Workspace(&OStack_48);
    local_38.m_ws = &OStack_48;
    bVar1 = SearchPolylinePart(this->m_root,polyline,0,
                               (polyline->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.
                               m_count,&local_38);
    ON_Workspace::~ON_Workspace(&OStack_48);
  }
  return bVar1;
}

Assistant:

bool ON_RTree::Search(
  const ON_Polyline* polyline,
  bool ON_CALLBACK_CDECL resultCallback(void* a_context, ON__INT_PTR a_id),
  ON_RTreePolylineContext* a_context
) const
{
  if (0 == m_root || 0 == polyline || nullptr == resultCallback) return false;
  if (polyline->UnsignedCount() < 2) return true;

  ON_RTreeSearchPolylineResultCallback result;
  result.m_context = a_context;
  result.m_resultCallback = resultCallback;
  ON_Workspace ws;
  result.m_ws = &ws;
  return SearchPolylinePart(m_root, polyline, 0, polyline->Count(), result);
}